

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_iostream_operator_unit_test.cpp
# Opt level: O2

void __thiscall
iostream_operator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>::test_method
          (iostream_operator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
           *this)

{
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *ppVar1;
  pointer ppVar2;
  uint uVar3;
  pointer pvVar4;
  int iVar5;
  ostream *poVar6;
  Filtration_value *pFVar7;
  pointer pvVar8;
  ifstream *__return_storage_ptr__;
  uint uVar9;
  Siblings *pSVar10;
  string iostream_file;
  Simplex_handle local_5d8;
  Simplex_handle local_5d0;
  Siblings local_5c8;
  undefined8 local_5a0;
  shared_count sStack_598;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> read_st;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> st;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  ifstream simplex_tree_istream;
  int local_438;
  ifstream *local_430;
  int local_428;
  ofstream simplex_tree_ostream;
  
  poVar6 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::clog,"SIMPLEX TREE IOSTREAM OPERATOR");
  std::endl<char,std::char_traits<char>>(poVar6);
  st.nodes_label_to_list_._M_h._M_buckets = &st.nodes_label_to_list_._M_h._M_single_bucket;
  st.nodes_label_to_list_._M_h._M_bucket_count = 1;
  st.nodes_label_to_list_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  st.nodes_label_to_list_._M_h._M_element_count = 0;
  st.nodes_label_to_list_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  st.nodes_label_to_list_._M_h._M_rehash_policy._M_next_resize = 0;
  st.nodes_label_to_list_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  st.null_vertex_ = -1;
  st.root_.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
        *)0x0;
  st.root_.parent_ = -1;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  st.dimension_ = -1;
  st.dimension_to_be_lowered_ = false;
  _simplex_tree_istream =
       (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&simplex_tree_ostream;
  _simplex_tree_ostream = (__buckets_ptr)0x100000000;
  iostream_file._M_dataplus._M_p._0_4_ = 0x40800000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            (&read_st,(initializer_list<int> *)&st,(Filtration_value *)&simplex_tree_istream);
  read_st.nodes_label_to_list_._M_h._M_buckets = (__buckets_ptr)0x400000003;
  read_st.nodes_label_to_list_._M_h._M_bucket_count =
       CONCAT44(read_st.nodes_label_to_list_._M_h._M_bucket_count._4_4_,5);
  iostream_file._M_dataplus._M_p._0_4_ = 0x40400000;
  _simplex_tree_istream = &read_st;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&simplex_tree_ostream,
             (initializer_list<int> *)&st,(Filtration_value *)&simplex_tree_istream);
  read_st.nodes_label_to_list_._M_h._M_buckets = (__buckets_ptr)0x3;
  iostream_file._M_dataplus._M_p._0_4_ = 0x40000000;
  _simplex_tree_istream = &read_st;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&simplex_tree_ostream,
             (initializer_list<int> *)&st,(Filtration_value *)&simplex_tree_istream);
  read_st.nodes_label_to_list_._M_h._M_buckets = (__buckets_ptr)0x100000002;
  read_st.nodes_label_to_list_._M_h._M_bucket_count =
       read_st.nodes_label_to_list_._M_h._M_bucket_count & 0xffffffff00000000;
  iostream_file._M_dataplus._M_p._0_4_ = 0x40400000;
  _simplex_tree_istream = &read_st;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&simplex_tree_ostream,
             (initializer_list<int> *)&st,(Filtration_value *)&simplex_tree_istream);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::initialize_filtration
            (&st,false);
  poVar6 = std::operator<<((ostream *)&std::clog,"The ORIGINAL complex contains ");
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::num_simplices(&st);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," simplices - dimension = ");
  iVar5 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::dimension(&st);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,
                           "Iterator on Simplices in the filtration, with [filtration value]:");
  std::endl<char,std::char_traits<char>>(poVar6);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::maybe_initialize_filtration
            (&st);
  pvVar4 = st.filtration_vect_.
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar8 = st.filtration_vect_.
                super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar8 != pvVar4; pvVar8 = pvVar8 + 1) {
    ppVar1 = pvVar8->m_ptr;
    poVar6 = std::operator<<((ostream *)&std::clog,"   ");
    poVar6 = std::operator<<(poVar6,"[");
    pFVar7 = (Filtration_value *)&ppVar1->second;
    if (ppVar1 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                   *)0x0) {
      pFVar7 = &Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
                Filtration_simplex_base_real::inf_;
    }
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
                                  *)pFVar7)->super_Filtration_simplex_base).filt_);
    std::operator<<(poVar6,"] ");
    __return_storage_ptr__ = &simplex_tree_istream;
    local_5d0.m_ptr = ppVar1;
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex_vertex_range
              ((Simplex_vertex_range *)__return_storage_ptr__,&st,&local_5d0);
    local_438 = 3;
    while ((__return_storage_ptr__ = *(ifstream **)__return_storage_ptr__,
           __return_storage_ptr__ != local_430 || (local_438 != local_428))) {
      poVar6 = (ostream *)std::ostream::operator<<(&std::clog,local_438);
      std::operator<<(poVar6," ");
      local_438 = *(int *)(__return_storage_ptr__ + 8);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iostream_file,"simplex_tree_for_iostream_operator_unit_test.txt",
             (allocator<char> *)&simplex_tree_istream);
  std::ofstream::ofstream
            (&simplex_tree_ostream,
             (char *)CONCAT44(iostream_file._M_dataplus._M_p._4_4_,
                              iostream_file._M_dataplus._M_p._0_4_),_S_out);
  Gudhi::operator<<((ostream *)&simplex_tree_ostream,&st);
  std::ofstream::close();
  read_st.nodes_label_to_list_._M_h._M_buckets = &read_st.nodes_label_to_list_._M_h._M_single_bucket
  ;
  read_st.nodes_label_to_list_._M_h._M_bucket_count = 1;
  read_st.nodes_label_to_list_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  read_st.nodes_label_to_list_._M_h._M_element_count = 0;
  read_st.nodes_label_to_list_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  read_st.nodes_label_to_list_._M_h._M_rehash_policy._M_next_resize = 0;
  read_st.nodes_label_to_list_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  read_st.null_vertex_ = -1;
  read_st.root_.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
        *)0x0;
  read_st.root_.parent_ = -1;
  read_st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  read_st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  read_st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  read_st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  read_st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  read_st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  read_st.dimension_ = -1;
  read_st.dimension_to_be_lowered_ = false;
  std::ifstream::ifstream
            (&simplex_tree_istream,
             (char *)CONCAT44(iostream_file._M_dataplus._M_p._4_4_,
                              iostream_file._M_dataplus._M_p._0_4_),_S_in);
  Gudhi::operator>>((istream *)&simplex_tree_istream,&read_st);
  poVar6 = std::operator<<((ostream *)&std::clog,"The READ complex contains ");
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::num_simplices(&read_st);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," simplices - dimension = ");
  iVar5 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::dimension(&read_st);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,
                           "Iterator on Simplices in the filtration, with [filtration value]:");
  std::endl<char,std::char_traits<char>>(poVar6);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::maybe_initialize_filtration
            (&read_st);
  pvVar4 = read_st.filtration_vect_.
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar8 = read_st.filtration_vect_.
                super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar8 != pvVar4; pvVar8 = pvVar8 + 1) {
    ppVar1 = pvVar8->m_ptr;
    poVar6 = std::operator<<((ostream *)&std::clog,"   ");
    poVar6 = std::operator<<(poVar6,"[");
    pFVar7 = (Filtration_value *)&ppVar1->second;
    if (ppVar1 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                   *)0x0) {
      pFVar7 = &Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
                Filtration_simplex_base_real::inf_;
    }
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
                                  *)pFVar7)->super_Filtration_simplex_base).filt_);
    std::operator<<(poVar6,"] ");
    local_5d8.m_ptr = ppVar1;
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex_vertex_range
              ((Simplex_vertex_range *)&local_5c8,&read_st,&local_5d8);
    ppVar2 = local_5c8.members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
    uVar3 = (uint)local_5c8.members_.m_flat_tree.m_data.m_seq.m_holder.m_size;
    pSVar10 = &local_5c8;
    uVar9 = local_5c8.parent_;
    while ((pSVar10 = (((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                         *)&pSVar10->oncles_)->m_Begin).sib_, pSVar10 != (Siblings *)ppVar2 ||
           (uVar9 != uVar3))) {
      poVar6 = (ostream *)std::ostream::operator<<(&std::clog,uVar9);
      std::operator<<(poVar6," ");
      uVar9 = pSVar10->parent_;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  }
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_iostream_operator_unit_test.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_450,0x5f);
  local_5c8.members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity._0_1_ =
       Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::operator==(&st,&read_st);
  local_5a0 = 0;
  sStack_598.pi_ = (sp_counted_base *)0x0;
  local_5c8.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = (stored_size_type)&local_470;
  local_470 = "st == read_st";
  local_468 = "";
  local_5c8.parent_ = local_5c8.parent_ & 0xffffff00;
  local_5c8.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
        *)&PTR__lazy_ostream_00133d20;
  local_5c8.members_.m_flat_tree.m_data.m_seq.m_holder.m_start =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_598);
  std::ifstream::~ifstream(&simplex_tree_istream);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::~Simplex_tree(&read_st);
  std::ofstream::~ofstream(&simplex_tree_ostream);
  std::__cxx11::string::~string((string *)&iostream_file);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::~Simplex_tree(&st);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(iostream_operator, Stree_type, list_of_tested_variants) {
  std::clog << "********************************************************************" << std::endl;
  std::clog << "SIMPLEX TREE IOSTREAM OPERATOR" << std::endl;

  Stree_type st;

  st.insert_simplex_and_subfaces({0, 1, 6, 7}, 4.0);
  st.insert_simplex_and_subfaces({3, 4, 5}, 3.0);
  st.insert_simplex_and_subfaces({3, 0}, 2.0);
  st.insert_simplex_and_subfaces({2, 1, 0}, 3.0);

  st.initialize_filtration();
  // Display the Simplex_tree
  std::clog << "The ORIGINAL complex contains " << st.num_simplices() << " simplices - dimension = "
            << st.dimension() << std::endl;
  std::clog << std::endl << std::endl << "Iterator on Simplices in the filtration, with [filtration value]:" << std::endl;
  for (auto f_simplex : st.filtration_simplex_range()) {
    std::clog << "   " << "[" << st.filtration(f_simplex) << "] ";
    for (auto vertex : st.simplex_vertex_range(f_simplex)) {
      std::clog << (int) vertex << " ";
    }
    std::clog << std::endl;
  }

  // st:
  //    1   6
  //    o---o
  //   /X\7/
  //  o---o---o---o
  //  2   0   3\X/4
  //            o
  //            5
  std::string iostream_file("simplex_tree_for_iostream_operator_unit_test.txt");
  std::ofstream simplex_tree_ostream(iostream_file.c_str());
  simplex_tree_ostream << st;
  simplex_tree_ostream.close();

  Stree_type read_st;
  std::ifstream simplex_tree_istream(iostream_file.c_str());
  simplex_tree_istream >> read_st;

  // Display the Simplex_tree
  std::clog << "The READ complex contains " << read_st.num_simplices() << " simplices - dimension = "
            << read_st.dimension() << std::endl;
  std::clog << std::endl << std::endl << "Iterator on Simplices in the filtration, with [filtration value]:" << std::endl;
  for (auto f_simplex : read_st.filtration_simplex_range()) {
    std::clog << "   " << "[" << read_st.filtration(f_simplex) << "] ";
    for (auto vertex : read_st.simplex_vertex_range(f_simplex)) {
      std::clog << (int) vertex << " ";
    }
    std::clog << std::endl;
  }

  BOOST_CHECK(st == read_st);
}